

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_client.h
# Opt level: O0

void __thiscall spdlog::details::udp_client::udp_client(udp_client *this,string *host,uint16_t port)

{
  uint16_t uVar1;
  int iVar2;
  char *__cp;
  uint16_t in_DX;
  int *in_RDI;
  int option_value;
  udp_client *in_stack_ffffffffffffff40;
  allocator *paVar3;
  allocator local_99;
  string local_98 [24];
  string *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [32];
  undefined4 local_50 [5];
  allocator local_39;
  string local_38 [38];
  uint16_t local_12;
  
  *in_RDI = -1;
  local_12 = in_DX;
  iVar2 = socket(2,2,0);
  *in_RDI = iVar2;
  if (*in_RDI < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"error: Create Socket Failed!",&local_39);
    throw_spdlog_ex(in_stack_ffffffffffffff80);
  }
  local_50[0] = 0x2800;
  iVar2 = setsockopt(*in_RDI,1,7,local_50,4);
  if (iVar2 < 0) {
    cleanup_(in_stack_ffffffffffffff40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"error: setsockopt(SO_SNDBUF) Failed!",&local_71);
    throw_spdlog_ex(in_stack_ffffffffffffff80);
  }
  *(undefined2 *)(in_RDI + 1) = 2;
  uVar1 = htons(local_12);
  *(uint16_t *)((long)in_RDI + 6) = uVar1;
  __cp = (char *)std::__cxx11::string::c_str();
  iVar2 = inet_aton(__cp,(in_addr *)(in_RDI + 2));
  if (iVar2 == 0) {
    cleanup_(in_stack_ffffffffffffff40);
    paVar3 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"error: Invalid address!",paVar3);
    throw_spdlog_ex(in_stack_ffffffffffffff80);
  }
  memset(in_RDI + 3,0,8);
  return;
}

Assistant:

udp_client(const std::string &host, uint16_t port)
    {
        socket_ = ::socket(PF_INET, SOCK_DGRAM, 0);
        if (socket_ < 0)
        {
            throw_spdlog_ex("error: Create Socket Failed!");
        }

        int option_value = TX_BUFFER_SIZE;
        if (::setsockopt(socket_, SOL_SOCKET, SO_SNDBUF, reinterpret_cast<const char *>(&option_value), sizeof(option_value)) < 0)
        {
            cleanup_();
            throw_spdlog_ex("error: setsockopt(SO_SNDBUF) Failed!");
        }

        sockAddr_.sin_family = AF_INET;
        sockAddr_.sin_port = htons(port);
        
        if (::inet_aton(host.c_str(), &sockAddr_.sin_addr) == 0) {
            cleanup_();
            throw_spdlog_ex("error: Invalid address!");
        }

        ::memset(sockAddr_.sin_zero, 0x00, sizeof(sockAddr_.sin_zero));
    }